

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_disableEnable_Test::testBody(TEST_MockCallTest_disableEnable_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockCallTest_disableEnable_Test *local_10;
  TEST_MockCallTest_disableEnable_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar3 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x21])();
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"");
  pMVar3 = mock(local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"function");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"differenFunction");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar3 = mock(&local_80,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar3->_vptr_MockSupport[0x26])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)((byte)((byte)iVar1 ^ 1) & 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x167,pTVar5);
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_90,"");
  pMVar3 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x22])();
  SimpleString::~SimpleString(&local_90);
  SimpleString::SimpleString(&local_a0,"");
  pMVar3 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"function");
  (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_b0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_c0,"");
  pMVar3 = mock(&local_c0,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x26])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar2 & 1),"CHECK","mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x16a,pTVar5);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"function");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_e0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar3 = mock(&local_f0,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_f0);
  return;
}

Assistant:

TEST(MockCallTest, disableEnable)
{
    mock().disable();
    mock().expectOneCall("function");
    mock().actualCall("differenFunction");
    CHECK(! mock().expectedCallsLeft());
    mock().enable();
    mock().expectOneCall("function");
    CHECK(mock().expectedCallsLeft());
    mock().actualCall("function");

    mock().checkExpectations();
}